

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

void __thiscall
ddd::DictionaryMLT<false,_true>::enumerate
          (DictionaryMLT<false,_false> *this,vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  bool bVar1;
  pointer this_00;
  reference pKVar2;
  value_type *in_RSI;
  long in_RDI;
  KvPair *prefix_kv;
  iterator __end2;
  iterator __begin2;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *__range2;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> prefix_kvs;
  value_type *in_stack_ffffffffffffff38;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *this_01;
  string local_a0 [8];
  size_type in_stack_ffffffffffffff68;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_ffffffffffffff70;
  __normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_> local_68
  ;
  undefined1 *local_60;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  DaTrie<false,_true,_false> *in_stack_ffffffffffffffd0;
  undefined1 local_28 [4];
  uint32_t in_stack_ffffffffffffffdc;
  DaTrie<false,_true,_true> *in_stack_ffffffffffffffe0;
  
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::clear
            ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)0x171171);
  std::
  unique_ptr<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x17117f);
  bVar1 = DaTrie<false,_true,_true>::is_empty((DaTrie<false,_true,_true> *)0x171187);
  if (!bVar1) {
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::reserve
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this_01 = (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)local_28;
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::vector
              ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)0x1711ba);
    this_00 = std::
              unique_ptr<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
              ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                            *)0x1711c8);
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb8);
    DaTrie<false,_true,_true>::enumerate_prefix
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
               (string *)in_stack_ffffffffffffffd0,
               (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    local_60 = local_28;
    local_68._M_current =
         (KvPair *)
         std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::begin
                   ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)in_stack_ffffffffffffff38);
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::end
              ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                               *)this_00,
                              (__normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      pKVar2 = __gnu_cxx::
               __normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
               ::operator*(&local_68);
      if ((int)pKVar2->value < 0) {
        in_stack_ffffffffffffff38 = in_RSI;
        std::__cxx11::string::string(local_a0,(string *)pKVar2);
        std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::push_back
                  ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)this_00,
                   in_stack_ffffffffffffff38);
        KvPair::~KvPair((KvPair *)0x1712b2);
      }
      else {
        std::
        vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
        ::operator[]((vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
                      *)(in_RDI + 0x10),(ulong)pKVar2->value);
        std::
        unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
        ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                      *)0x171321);
        DaTrie<false,_true,_false>::enumerate
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb8);
      }
      __gnu_cxx::
      __normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>::
      operator++(&local_68);
    }
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector(this_01);
  }
  return;
}

Assistant:

void enumerate(std::vector<KvPair>& kvs) const {
    kvs.clear();
    if (prefix_subtrie_->is_empty()) {
      return;
    }
    kvs.reserve(num_keys_);

    std::vector<KvPair> prefix_kvs;
    prefix_subtrie_->enumerate_prefix(ROOT_POS, std::string{}, prefix_kvs);

    for (const auto& prefix_kv : prefix_kvs) {
      if ((prefix_kv.value >> 31) == 1) { // is terminal
        kvs.push_back(KvPair{prefix_kv.key, prefix_kv.value & (1U << 31)});
      } else {
        suffix_subtries_[prefix_kv.value]->enumerate(ROOT_POS, prefix_kv.key, kvs);
      }
    }
  }